

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O2

void Centaurus::MatchRoutineEM64T<char>::emit
               (X86Assembler *as,MyConstPool *pool,Label *rejectlabel,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  pointer pcVar1;
  Block *pBVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  int i;
  Block *pBVar6;
  Block *pBVar7;
  Data128 data;
  Data128 d1;
  Operand_ *local_80;
  undefined1 local_78 [64];
  size_t local_38;
  
  pBVar2 = (Block *)str->_M_string_length;
  pBVar6 = (Block *)0x0;
  local_80 = (Operand_ *)rejectlabel;
  local_78._48_8_ = pool;
  if (pBVar2 < (Block *)0x8) {
    for (; pBVar6 < pBVar2; pBVar6 = (Block *)((long)&pBVar6->prev + 1)) {
      d1.df[0] = 8.28907076174039e-317;
      d1.sd[3] = 6;
      d1.sd[2] = 0;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x1ad,(Operand_ *)(asmjit::x86OpData + 0x480),(Operand_ *)&d1);
      asmjit::CodeEmitter::emit((CodeEmitter *)as,0x105,(Operand_ *)(asmjit::x86OpData + 0x4e0));
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),
                 (uint)pBVar6->data[(long)((str->_M_dataplus)._M_p + -0x18)]);
      asmjit::CodeEmitter::emit((CodeEmitter *)as,0x124,local_80);
      pBVar2 = (Block *)str->_M_string_length;
    }
  }
  else {
    local_78._32_4_ = 0x183878;
    local_78._36_4_ = 0;
    local_78._40_8_ = asmjit::x86OpData + 0x4e0;
    local_78._16_8_ = asmjit::x86OpData + 0x490;
    local_78._24_8_ = str;
    while( true ) {
      pBVar7 = (Block *)(long)(int)pBVar6;
      puVar3 = (uint8_t *)((long)pBVar2 - (long)pBVar7);
      if (pBVar2 < pBVar7 || puVar3 == (uint8_t *)0x0) break;
      pcVar1 = ((_Alloc_hider *)&((Block *)str)->prev)->_M_p;
      puVar5 = (uint8_t *)0x10;
      if (puVar3 < (uint8_t *)0x10) {
        puVar5 = puVar3;
      }
      if ((uint8_t *)0xf < puVar3) {
        puVar3 = (uint8_t *)0x10;
      }
      for (puVar4 = (uint8_t *)0x0; puVar3 != puVar4; puVar4 = puVar4 + 1) {
        d1.sb[(long)puVar4] = puVar4[(long)(pBVar7->data + (long)(pcVar1 + -0x18))];
      }
      local_78._0_8_ = &DAT_00000032;
      local_78._8_8_ = (uint8_t *)0x600000000;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x191,(Operand_ *)(asmjit::x86OpData + 0x700),
                 (Operand_ *)local_78);
      data.sq[1] = d1.sq[0];
      data.sq[0] = local_78._48_8_;
      MyConstPool::add((MyConstPool *)local_78,data);
      local_78._56_8_ = 3;
      local_38 = 0x18;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x1e1,(Operand_ *)(asmjit::x86OpData + 0x700),
                 (Operand_ *)local_78,(Operand_ *)(local_78 + 0x38));
      str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._24_8_;
      local_78._0_8_ = (X86Assembler *)0x3;
      local_78._8_8_ = puVar5;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x67,(Operand_ *)local_78._16_8_,(Operand_ *)local_78);
      asmjit::CodeEmitter::emit((CodeEmitter *)as,0x115,local_80);
      asmjit::CodeEmitter::emit((CodeEmitter *)as,7,(Operand_ *)local_78._40_8_,(int)puVar5);
      pBVar2 = *(Block **)((long)str + 8);
      pBVar6 = (Block *)(ulong)((int)pBVar6 + 0x10);
    }
  }
  return;
}

Assistant:

void MatchRoutineEM64T<TCHAR>::emit(asmjit::X86Assembler& as, MyConstPool& pool, asmjit::Label& rejectlabel, const std::basic_string<TCHAR>& str)
{
    if (str.size() < 8)
    {
        for (int i = 0; i < str.size(); i++)
        {
            if (sizeof(TCHAR) == 1)
            {
                as.movzx(CHAR_REG, asmjit::x86::byte_ptr(INPUT_REG, 0));
                as.inc(INPUT_REG);
            }
            else
            {
                as.movzx(CHAR_REG, asmjit::x86::word_ptr(INPUT_REG, 0));
                as.add(INPUT_REG, 2);
            }
            as.cmp(CHAR_REG, str[i]);
            as.jne(rejectlabel);
        }
    }
    else
    {
        for (int i = 0; i < str.size(); i += 16 / sizeof(TCHAR))
        {
            int l1 = std::min(str.size() - i, (size_t)(16 / sizeof(TCHAR)));

            asmjit::Data128 d1;

            for (int j = 0; j < l1; j++)
            {
                if (sizeof(TCHAR) == 1)
                    d1.ub[j] = str[i + j];
                else
                    d1.uw[j] = str[i + j];
            }

            as.movdqu(LOAD_REG, asmjit::X86Mem(INPUT_REG, 0));
            as.pcmpistri(LOAD_REG, pool.add(d1), asmjit::Imm(sizeof(TCHAR) == 1 ? 0x18 : 0x19));
            as.cmp(INDEX_REG, asmjit::Imm(l1));
            as.jb(rejectlabel);
            as.add(INPUT_REG, l1);
        }
    }
}